

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O2

void __thiscall PeleLM::initActiveControl(PeleLM *this)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  Real RVar14;
  long lVar15;
  undefined4 uVar16;
  ACParm *pAVar17;
  ACParm *pAVar18;
  DataContainer *pDVar19;
  int n;
  int iVar20;
  ostream *poVar21;
  Print *pPVar22;
  int dim;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  long lVar26;
  int iVar27;
  int iVar28;
  ulong uVar29;
  GeometryData *pGVar30;
  ulong uVar31;
  Real *pRVar32;
  ulong uVar33;
  int iVar34;
  ulong uVar35;
  uint j_1;
  uint uVar36;
  uint uVar37;
  int iVar38;
  uint j;
  uint uVar39;
  byte bVar40;
  double dVar41;
  double dVar42;
  Real local_688 [4];
  ProbParm *local_668;
  pointer local_660;
  pointer local_658;
  long local_650;
  undefined1 local_648 [16];
  undefined1 local_638 [16];
  undefined1 local_628 [16];
  undefined1 local_618 [16];
  undefined1 local_608 [16];
  undefined1 local_5f8 [16];
  undefined1 local_5e8 [16];
  undefined1 local_5d8 [16];
  undefined1 local_5c8 [16];
  undefined1 local_5b8 [16];
  double local_5a8;
  ParmParse ppAC;
  DeviceVector<amrex::Real> s_ext_v;
  undefined1 local_528 [16];
  undefined1 local_518 [16];
  undefined1 local_508 [16];
  double local_4f8;
  double dStack_4f0;
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [16];
  undefined1 local_4c8 [16];
  undefined1 local_4b8 [16];
  undefined1 local_4a8 [16];
  undefined1 local_498 [16];
  double local_488;
  Real tmp [21];
  GpuArray<double,_25U> pmf_vals;
  Real molefrac [21];
  Real s_ext [28];
  GeometryData geomdata;
  
  bVar40 = 0;
  if ((this->super_NavierStokesBase).super_AmrLevel.level == 0) {
    if (1 < NavierStokesBase::verbose) {
      poVar21 = amrex::OutStream();
      amrex::Print::Print((Print *)&pmf_vals,poVar21);
      std::operator<<((ostream *)(pmf_vals.arr + 2),"PeleLM::initActiveControl()\n");
      amrex::Print::~Print((Print *)&pmf_vals);
    }
    std::__cxx11::string::string((string *)&pmf_vals,"active_control",(allocator *)s_ext);
    amrex::ParmParse::ParmParse(&ppAC,(string *)&pmf_vals);
    std::__cxx11::string::~string((string *)&pmf_vals);
    amrex::ParmParse::query(&ppAC,"on",&ctrl_active,0);
    amrex::ParmParse::query(&ppAC,"use_temp",&ctrl_use_temp,0);
    amrex::ParmParse::query(&ppAC,"temperature",&ctrl_temperature,0);
    amrex::ParmParse::query(&ppAC,"tau",&ctrl_tauControl,0);
    amrex::ParmParse::query(&ppAC,"v",&ctrl_verbose,0);
    amrex::ParmParse::query(&ppAC,"height",&ctrl_h,0);
    amrex::ParmParse::query(&ppAC,"changeMax",&ctrl_changeMax,0);
    amrex::ParmParse::query(&ppAC,"velMax",&ctrl_velMax,0);
    amrex::ParmParse::query(&ppAC,"pseudo_gravity",&ctrl_pseudoGravity,0);
    amrex::ParmParse::query(&ppAC,"flame_direction",&ctrl_flameDir,0);
    amrex::ParmParse::query(&ppAC,"AC_history",&ctrl_AChistory_abi_cxx11_,0);
    amrex::ParmParse::query(&ppAC,"npoints_average",&ctrl_NavgPts,0);
    amrex::ParmParse::query(&ppAC,"method",&ctrl_method,0);
    if ((ctrl_use_temp == true) && (ctrl_temperature <= 0.0)) {
      amrex::Error_host("active_control.temperature MUST be set with active_control.use_temp = 1");
    }
    if ((ctrl_active == true) && (ctrl_tauControl <= 0.0)) {
      amrex::Error_host("active_control.tau MUST be set when using active_control");
    }
    if (((ctrl_active & 1U) != 0) && (ctrl_h <= 0.0)) {
      amrex::Error_host("active_control.height MUST be set when using active_control");
    }
    if (((ctrl_active & 1U) != 0) && (2 < ctrl_flameDir)) {
      amrex::Error_host("active_control.flame_direction MUST be 0, 1 or 2 for X, Y and Z resp.");
    }
    pAVar17 = ac_parm;
    if ((ctrl_active & 1U) == 0) {
      ac_parm->ctrl_active = 0;
      pAVar18 = ac_parm_d;
      uVar4 = pAVar17->ctrl_active;
      uVar16 = *(undefined4 *)&pAVar17->field_0x1c;
      ac_parm_d->ctrl_tBase = pAVar17->ctrl_tBase;
      pAVar18->ctrl_active = uVar4;
      *(undefined4 *)&pAVar18->field_0x1c = uVar16;
      RVar14 = pAVar17->ctrl_V_in;
      pAVar18->ctrl_dV = pAVar17->ctrl_dV;
      pAVar18->ctrl_V_in = RVar14;
    }
    else {
      ac_parm->ctrl_active = 1;
      pmf_vals.arr[0] = -1.0;
      std::vector<double,_std::allocator<double>_>::resize
                (&ctrl_time_pts.super_vector<double,_std::allocator<double>_>,(long)ctrl_NavgPts + 1
                 ,pmf_vals.arr);
      pmf_vals.arr[0] = -1.0;
      std::vector<double,_std::allocator<double>_>::resize
                (&ctrl_velo_pts.super_vector<double,_std::allocator<double>_>,(long)ctrl_NavgPts + 1
                 ,pmf_vals.arr);
      pmf_vals.arr[0] = -1.0;
      std::vector<double,_std::allocator<double>_>::resize
                (&ctrl_cntl_pts.super_vector<double,_std::allocator<double>_>,(long)ctrl_NavgPts + 1
                 ,pmf_vals.arr);
      pDVar19 = pmf_data.m_data_d;
      pAVar17 = ac_parm_d;
      local_668 = prob_parm_d;
      dVar7 = 1.0;
      for (uVar25 = 0; uVar25 != 3; uVar25 = uVar25 + 1) {
        if ((uint)ctrl_flameDir != uVar25) {
          dVar7 = dVar7 * ((this->super_NavierStokesBase).super_AmrLevel.geom.prob_domain.xhi
                           [uVar25] -
                          (this->super_NavierStokesBase).super_AmrLevel.geom.prob_domain.xlo[uVar25]
                          );
        }
      }
      amrex::PODVector<double,_std::allocator<double>_>::PODVector(&s_ext_v,0x1c);
      iVar34 = ctrl_flameDir;
      local_688[0] = (this->super_NavierStokesBase).super_AmrLevel.geom.prob_domain.xlo[0];
      local_688[1] = (this->super_NavierStokesBase).super_AmrLevel.geom.prob_domain.xlo[1];
      local_688[2] = (this->super_NavierStokesBase).super_AmrLevel.geom.prob_domain.xlo[2];
      local_688[ctrl_flameDir] = local_688[ctrl_flameDir] + -1.0;
      amrex::Geometry::data(&(this->super_NavierStokesBase).super_AmrLevel.geom);
      s_ext[2] = local_688[2];
      s_ext[0] = local_688[0];
      s_ext[1] = local_688[1];
      local_658 = s_ext_v.m_data;
      s_ext[3] = (Real)s_ext_v.m_data;
      s_ext[4] = (Real)CONCAT44(s_ext[4]._4_4_,iVar34);
      s_ext[5] = -1.0;
      pGVar30 = &geomdata;
      pRVar32 = s_ext + 6;
      for (lVar26 = 0xf; lVar26 != 0; lVar26 = lVar26 + -1) {
        *pRVar32 = (pGVar30->prob_domain).xlo[0];
        pGVar30 = (GeometryData *)((long)pGVar30 + (ulong)bVar40 * -0x10 + 8);
        pRVar32 = pRVar32 + (ulong)bVar40 * -2 + 1;
      }
      s_ext[0x15] = (Real)local_668;
      s_ext[0x16] = (Real)pAVar17;
      s_ext[0x17] = (Real)pDVar19;
      local_660 = s_ext_v.m_data;
      memset(&pmf_vals,0,200);
      memset(molefrac,0,0xa8);
      dVar2 = s_ext[(long)iVar34 + 6];
      if (pDVar19->m_doAverage == 0) {
        dVar42 = (dVar2 + dVar2) * 0.5;
        pdVar5 = pDVar19->pmf_X;
        uVar4 = pDVar19->m_nPoint;
        uVar29 = (ulong)(uVar4 - 1);
        uVar25 = (ulong)-(uint)(*pdVar5 <= dVar42);
        if (pdVar5[uVar29] <= dVar42 && dVar42 != pdVar5[uVar29]) {
          uVar25 = uVar29;
        }
        uVar23 = (uint)uVar25;
        if (uVar23 == 0xffffffff) {
          uVar25 = 0xffffffffffffffff;
          uVar31 = 0xffffffff;
          uVar33 = 0;
          while (uVar23 = (uint)uVar31, uVar29 != uVar33) {
            if ((dVar42 < pdVar5[uVar33]) || (pdVar5[uVar33 + 1] < dVar42)) {
              uVar33 = uVar33 + 1;
            }
            else {
              uVar31 = uVar33 + 1;
              uVar25 = uVar33 & 0xffffffff;
              uVar33 = uVar31;
            }
          }
        }
        uVar39 = pDVar19->m_nVar;
        uVar24 = (uint)uVar25;
        uVar37 = uVar23;
        for (uVar36 = 0; uVar39 != uVar36; uVar36 = uVar36 + 1) {
          dVar42 = pDVar19->pmf_Y[uVar25 & 0xffffffff];
          dVar41 = 0.0;
          if (uVar24 != uVar23) {
            dVar41 = (pDVar19->pmf_Y[uVar37] - dVar42) / (pdVar5[(int)uVar23] - pdVar5[(int)uVar24])
            ;
          }
          pmf_vals.arr[(int)uVar36] = (dVar2 - pdVar5[(int)uVar24]) * dVar41 + dVar42;
          uVar37 = uVar37 + uVar4;
          uVar25 = (ulong)((int)uVar25 + uVar4);
        }
      }
      else {
        pdVar5 = pDVar19->pmf_X;
        uVar4 = pDVar19->m_nPoint;
        uVar29 = (ulong)(uVar4 - 1);
        uVar25 = (ulong)-(uint)(*pdVar5 <= dVar2);
        if (pdVar5[uVar29] <= dVar2 && dVar2 != pdVar5[uVar29]) {
          uVar25 = uVar29;
        }
        iVar20 = (int)uVar25;
        iVar34 = iVar20;
        iVar38 = iVar20;
        if (iVar20 == -1) {
          uVar31 = 0xffffffffffffffff;
          uVar25 = 0xffffffff;
          uVar33 = 0;
          while (iVar20 = (int)uVar31, uVar29 != uVar33) {
            if ((dVar2 < pdVar5[uVar33]) || (pdVar5[uVar33 + 1] < dVar2)) {
              uVar33 = uVar33 + 1;
            }
            else {
              uVar25 = uVar33 + 1;
              uVar31 = uVar33 & 0xffffffff;
              uVar33 = uVar25;
            }
          }
          uVar31 = 0xffffffffffffffff;
          uVar35 = 0xffffffff;
          uVar33 = 0;
          while (iVar38 = (int)uVar31, iVar34 = (int)uVar35, uVar29 != uVar33) {
            if ((dVar2 < pdVar5[uVar33]) || (pdVar5[uVar33 + 1] < dVar2)) {
              uVar33 = uVar33 + 1;
            }
            else {
              uVar31 = uVar33 + 1;
              uVar35 = uVar33 & 0xffffffff;
              uVar33 = uVar31;
            }
          }
        }
        uVar23 = pDVar19->m_nVar;
        iVar27 = (int)uVar25;
        local_650 = (long)iVar38;
        for (uVar39 = 0; uVar39 != uVar23; uVar39 = uVar39 + 1) {
          iVar28 = uVar39 * uVar4;
          pRVar32 = pDVar19->pmf_Y;
          dVar42 = pdVar5[iVar27];
          dVar41 = 0.0;
          if (iVar20 != iVar27) {
            dVar41 = (pRVar32[(uint)(iVar27 + iVar28)] - pRVar32[(uint)(iVar20 + iVar28)]) /
                     (dVar42 - pdVar5[iVar20]);
          }
          dVar41 = (dVar2 - pdVar5[iVar20]) * dVar41 + pRVar32[(uint)(iVar20 + iVar28)];
          if (iVar20 == iVar34) {
            dVar41 = (dVar41 + dVar41) * 0.5;
          }
          else {
            dVar3 = pRVar32[(uint)(iVar34 + iVar28)];
            dVar8 = 0.0;
            if (iVar34 != iVar38) {
              dVar8 = (pRVar32[(uint)(iVar28 + iVar38)] - dVar3) / (pdVar5[iVar38] - pdVar5[iVar34])
              ;
            }
            dVar9 = dVar2 - pdVar5[iVar34];
            dVar41 = (dVar8 * dVar9 + dVar3 + dVar3) * dVar9 * 0.5 +
                     (dVar42 - dVar2) * 0.5 * (pRVar32[(uint)(iVar27 + iVar28)] + dVar41);
            uVar29 = uVar25 & 0xffffffff;
            for (lVar26 = (long)iVar27; lVar26 < iVar34; lVar26 = lVar26 + 1) {
              lVar15 = lVar26 + 1;
              pdVar1 = pRVar32 + uVar29;
              uVar29 = (ulong)((int)uVar29 + 1);
              dVar41 = dVar41 + (*pdVar1 + pRVar32[uVar29]) * (pdVar5[lVar15] - dVar42) * 0.5;
              dVar42 = pdVar5[lVar15];
            }
            dVar41 = dVar41 / (dVar2 - dVar2);
          }
          pmf_vals.arr[(int)uVar39] = dVar41;
          uVar25 = (ulong)((int)uVar25 + uVar4);
        }
      }
      *local_660 = 0.0;
      local_660[1] = 0.0;
      local_660[2] = pmf_vals.arr[1] * 0.01;
      local_660[0x1a] = pmf_vals.arr[0];
      for (lVar26 = 0; lVar26 != 0x15; lVar26 = lVar26 + 1) {
        molefrac[lVar26] = pmf_vals.arr[lVar26 + 3];
      }
      dVar42 = 1.0 / (molefrac[0x13] * 28.014 +
                      molefrac[0x12] * 30.07 +
                      molefrac[0x11] * 29.062 +
                      molefrac[0x10] * 28.054 +
                      molefrac[0xf] * 31.034 +
                      molefrac[0xe] * 30.026 +
                      molefrac[0xd] * 29.018 +
                      molefrac[0xc] * 44.009 +
                      molefrac[0xb] * 28.01 +
                      molefrac[10] * 16.043 +
                      molefrac[9] * 15.035 +
                      molefrac[8] * 14.027 +
                      molefrac[7] * 14.027 +
                      molefrac[6] * 33.006 +
                      molefrac[5] * 18.015 +
                      molefrac[4] * 17.007 +
                      molefrac[3] * 31.998 +
                      molefrac[2] * 15.999 + molefrac[1] * 1.008 + molefrac[0] * 2.016 + 0.0 +
                     molefrac[0x14] * 39.95);
      dVar2 = molefrac[1] * 1.008 * dVar42;
      local_528._8_4_ = SUB84(dVar2,0);
      local_528._0_8_ = molefrac[0] * 2.016 * dVar42;
      local_528._12_4_ = (int)((ulong)dVar2 >> 0x20);
      dVar2 = molefrac[3] * 31.998 * dVar42;
      local_518._8_4_ = SUB84(dVar2,0);
      local_518._0_8_ = molefrac[2] * 15.999 * dVar42;
      local_518._12_4_ = (int)((ulong)dVar2 >> 0x20);
      dVar2 = molefrac[5] * 18.015 * dVar42;
      local_508._8_4_ = SUB84(dVar2,0);
      local_508._0_8_ = molefrac[4] * 17.007 * dVar42;
      local_508._12_4_ = (int)((ulong)dVar2 >> 0x20);
      local_4f8 = molefrac[6] * 33.006 * dVar42;
      dStack_4f0 = molefrac[7] * 14.027 * dVar42;
      dVar2 = molefrac[9] * 15.035 * dVar42;
      local_4e8._8_4_ = SUB84(dVar2,0);
      local_4e8._0_8_ = molefrac[8] * 14.027 * dVar42;
      local_4e8._12_4_ = (int)((ulong)dVar2 >> 0x20);
      dVar2 = molefrac[0xb] * 28.01 * dVar42;
      local_4d8._8_4_ = SUB84(dVar2,0);
      local_4d8._0_8_ = molefrac[10] * 16.043 * dVar42;
      local_4d8._12_4_ = (int)((ulong)dVar2 >> 0x20);
      dVar2 = molefrac[0xd] * 29.018 * dVar42;
      local_4c8._8_4_ = SUB84(dVar2,0);
      local_4c8._0_8_ = molefrac[0xc] * 44.009 * dVar42;
      local_4c8._12_4_ = (int)((ulong)dVar2 >> 0x20);
      dVar2 = molefrac[0xf] * 31.034 * dVar42;
      local_4b8._8_4_ = SUB84(dVar2,0);
      local_4b8._0_8_ = molefrac[0xe] * 30.026 * dVar42;
      local_4b8._12_4_ = (int)((ulong)dVar2 >> 0x20);
      dVar2 = molefrac[0x11] * 29.062 * dVar42;
      local_4a8._8_4_ = SUB84(dVar2,0);
      local_4a8._0_8_ = molefrac[0x10] * 28.054 * dVar42;
      local_4a8._12_4_ = (int)((ulong)dVar2 >> 0x20);
      dVar2 = molefrac[0x13] * 28.014 * dVar42;
      local_498._8_4_ = SUB84(dVar2,0);
      local_498._0_8_ = molefrac[0x12] * 30.07 * dVar42;
      local_498._12_4_ = (int)((ulong)dVar2 >> 0x20);
      local_488 = dVar42 * molefrac[0x14] * 39.95;
      dVar2 = local_668->P_mean;
      local_648._8_8_ = 0x3fefbefbefbefbf0;
      local_648._0_8_ = 0x3fdfbefbefbefbf0;
      local_638._8_8_ = 0x3fa000418a43bf8c;
      local_638._0_8_ = 0x3fb000418a43bf8c;
      local_628._8_8_ = 0x3fac6bb6f569cbd9;
      local_628._0_8_ = 0x3fae1af1b70e12fe;
      local_618._8_8_ = 0x3fb24021df7a429e;
      local_618._0_8_ = 0x3f9f065042c3dbd3;
      local_608._8_8_ = 0x3fb106e55a53f15b;
      local_608._0_8_ = 0x3fb24021df7a429e;
      local_5f8._8_8_ = 0x3fa24778bbe8f7dd;
      local_5f8._0_8_ = 0x3fafea0b02aa32d7;
      local_5e8._8_8_ = 0x3fa1a4eba7fd99b3;
      local_5e8._0_8_ = 0x3f9744998b9a1c0d;
      local_5d8._8_8_ = 0x3fa07f7f2eefd932;
      local_5d8._0_8_ = 0x3fa10d488e47ecc4;
      local_5c8._8_8_ = 0x3fa19e14f6ff5920;
      local_5c8._0_8_ = 0x3fa24021df7a429e;
      local_5b8._8_8_ = 0x3fa246cdaf410bdd;
      local_5b8._0_8_ = 0x3fa106e55a53f15b;
      local_5a8 = 0.025031289111389236;
      for (lVar26 = 0; lVar26 != 0x15; lVar26 = lVar26 + 1) {
        tmp[lVar26] = *(double *)(local_528 + lVar26 * 8) * *(double *)(local_648 + lVar26 * 8);
      }
      dVar42 = 0.0;
      for (lVar26 = 0; lVar26 != 0x15; lVar26 = lVar26 + 1) {
        dVar42 = dVar42 + tmp[lVar26];
      }
      dVar2 = ((dVar2 * 10.0) / (dVar42 * pmf_vals.arr[0] * 83144626.1815324)) * 1000.0;
      local_660[3] = dVar2;
      tmp[0] = 0.49603174603174605;
      tmp[1] = 0.9920634920634921;
      tmp[2] = 0.06250390649415588;
      tmp[3] = 0.03125195324707794;
      tmp[4] = 0.05879931792791203;
      tmp[5] = 0.055509297807382736;
      tmp[6] = 0.030297521662727988;
      tmp[7] = 0.07129108148570615;
      tmp[8] = 0.07129108148570615;
      tmp[9] = 0.06651147322913202;
      tmp[10] = 0.06233248145608677;
      tmp[0xb] = 0.035701535166012134;
      tmp[0xc] = 0.022722624917630486;
      tmp[0xd] = 0.03446136880556896;
      tmp[0xe] = 0.033304469459801506;
      tmp[0xf] = 0.032222723464587225;
      tmp[0x10] = 0.035645540742853074;
      tmp[0x11] = 0.034409194136673316;
      dVar3 = pmf_vals.arr[0] * pmf_vals.arr[0];
      tmp[0x12] = 0.03325573661456601;
      tmp[0x13] = 0.03569643749553795;
      dVar41 = pmf_vals.arr[0] * dVar3;
      dVar8 = pmf_vals.arr[0] * dVar41;
      tmp[0x14] = 0.025031289111389236;
      dVar42 = 1.0 / pmf_vals.arr[0];
      if (1000.0 <= pmf_vals.arr[0]) {
        dVar9 = dVar42 * 25473.6599 +
                dVar8 * 9.96394714e-23 +
                dVar41 * -1.18378809e-18 +
                dVar3 * 5.38539827e-15 + pmf_vals.arr[0] * -1.15421486e-11 + 2.50000001;
        local_648._8_4_ = SUB84(dVar9,0);
        local_648._0_8_ =
             dVar42 * -950.158922 +
             dVar8 * 4.00510752e-15 +
             dVar41 * -4.48915985e-11 +
             dVar3 * 1.66485593e-07 + pmf_vals.arr[0] * -2.47012365e-05 + 3.3372792;
        local_648._12_4_ = (int)((ulong)dVar9 >> 0x20);
        dVar9 = dVar42 * -1088.45772 +
                dVar8 * -4.33435588e-15 +
                dVar41 * 5.23676387e-11 +
                dVar3 * -2.52655556e-07 + pmf_vals.arr[0] * 0.00074154377 + 3.28253784;
        local_638._8_4_ = SUB84(dVar9,0);
        local_638._0_8_ =
             dVar42 * 29217.5791 +
             dVar8 * 2.45667382e-16 +
             dVar41 * -2.50444497e-12 +
             dVar3 * 1.39828196e-08 + pmf_vals.arr[0] * -4.29870569e-05 + 2.56942078;
        local_638._12_4_ = (int)((ulong)dVar9 >> 0x20);
        dVar9 = dVar42 * -30004.2971 +
                dVar8 * 3.36401984e-15 +
                dVar41 * -2.42604967e-11 +
                dVar3 * -5.46908393e-08 + pmf_vals.arr[0] * 0.00108845902 + 3.03399249;
        local_628._8_4_ = SUB84(dVar9,0);
        local_628._0_8_ =
             dVar42 * 3858.657 +
             dVar8 * 2.34824752e-15 +
             dVar41 * -2.19865389e-11 +
             dVar3 * 4.21684093e-08 + pmf_vals.arr[0] * 0.000274214858 + 3.09288767;
        local_628._12_4_ = (int)((ulong)dVar9 >> 0x20);
        dVar9 = dVar42 * 46263.604 +
                dVar8 * -3.75455134e-15 +
                dVar41 * 6.50448872e-11 +
                dVar3 * -4.69648657e-07 + pmf_vals.arr[0] * 0.00182819646 + 2.87410113;
        local_618._8_4_ = SUB84(dVar9,0);
        local_618._0_8_ =
             dVar42 * 111.856713 +
             dVar8 * -2.1581707e-15 +
             dVar41 * 2.85615925e-11 +
             dVar3 * -2.11219383e-07 + pmf_vals.arr[0] * 0.00111991006 + 4.0172109;
        local_618._12_4_ = (int)((ulong)dVar9 >> 0x20);
        dVar9 = dVar42 * 16775.5843 +
                dVar8 * -9.34308788e-15 +
                dVar41 * 1.48921161e-10 +
                dVar3 * -9.95714493e-07 + pmf_vals.arr[0] * 0.00361995018 + 2.28571772;
        local_608._8_4_ = SUB84(dVar9,0);
        local_608._0_8_ =
             dVar42 * 50925.9997 +
             dVar8 * -6.7943273e-15 +
             dVar41 * 1.044765e-10 +
             dVar3 * -6.70639823e-07 + pmf_vals.arr[0] * 0.00232794318 + 2.29203842;
        local_608._12_4_ = (int)((ulong)dVar9 >> 0x20);
        dVar9 = dVar42 * -14151.8724 +
                dVar8 * -4.07295432e-15 +
                dVar41 * 5.7513252e-11 +
                dVar3 * -3.32941924e-07 + pmf_vals.arr[0] * 0.00103126372 + 2.71518561;
        local_5f8._8_4_ = SUB84(dVar9,0);
        local_5f8._0_8_ =
             dVar42 * -9468.34459 +
             dVar8 * -2.0363046e-14 +
             dVar41 * 3.05731338e-10 +
             dVar3 * -1.9109527e-06 + pmf_vals.arr[0] * 0.00669547335 + 0.074851495;
        local_5f8._12_4_ = (int)((ulong)dVar9 >> 0x20);
        dVar9 = dVar42 * 4011.91815 +
                dVar8 * -1.06701742e-14 +
                dVar41 * 1.47290445e-10 +
                dVar3 * -8.28152043e-07 + pmf_vals.arr[0] * 0.00247847763 + 2.77217438;
        local_5e8._8_4_ = SUB84(dVar9,0);
        local_5e8._0_8_ =
             dVar42 * -48759.166 +
             dVar8 * -9.44168328e-15 +
             dVar41 * 1.30872547e-10 +
             dVar3 * -7.38271347e-07 + pmf_vals.arr[0] * 0.00220718513 + 3.85746029;
        local_5e8._12_4_ = (int)((ulong)dVar9 >> 0x20);
        dVar9 = dVar42 * 127.83252 +
                dVar8 * -4.225232e-15 +
                dVar41 * 9.8610775e-11 +
                dVar3 * -8.85461333e-07 + pmf_vals.arr[0] * 0.0039357485 + 3.770799;
        local_5d8._8_4_ = SUB84(dVar9,0);
        local_5d8._0_8_ =
             dVar42 * -13995.8323 +
             dVar8 * -1.76771128e-14 +
             dVar41 * 2.5160303e-10 +
             dVar3 * -1.47419604e-06 + pmf_vals.arr[0] * 0.00460000041 + 1.76069008;
        local_5d8._12_4_ = (int)((ulong)dVar9 >> 0x20);
        dVar12 = dVar42 * 4939.88614 +
                 dVar8 * -2.51412122e-14 +
                 dVar41 * 3.68057308e-10 +
                 dVar3 * -2.23692638e-06 + pmf_vals.arr[0] * 0.00732270755 + 2.03611116;
        dVar13 = dVar42 * 12857.52 +
                 dVar8 * -2.99283152e-14 +
                 dVar41 * 4.38044223e-10 +
                 dVar3 * -2.66068889e-06 + pmf_vals.arr[0] * 0.0086986361 + 1.95465642;
        dVar10 = dVar8 * -3.8000578e-14 +
                 dVar41 * 5.53530003e-10 +
                 dVar3 * -3.3418689e-06 + pmf_vals.arr[0] * 0.0108426339 + 1.0718815;
        dVar11 = dVar8 * -1.3506702e-15 +
                 dVar41 * 2.5242595e-11 +
                 dVar3 * -1.89492e-07 + pmf_vals.arr[0] * 0.0007439884 + 2.92664;
        dVar9 = -11426.3932;
        dVar6 = -922.7977;
      }
      else {
        dVar9 = dVar42 * 25473.6599 +
                dVar8 * -1.85546466e-22 +
                dVar41 * 5.7520408e-19 +
                dVar3 * -6.65306547e-16 + pmf_vals.arr[0] * 3.52666409e-13 + 2.5;
        local_648._8_4_ = SUB84(dVar9,0);
        local_648._0_8_ =
             dVar42 * -917.935173 +
             dVar8 * -1.47522352e-12 +
             dVar41 * 5.03930235e-09 +
             dVar3 * -6.492717e-06 + pmf_vals.arr[0] * 0.00399026037 + 2.34433112;
        local_648._12_4_ = (int)((ulong)dVar9 >> 0x20);
        dVar9 = dVar42 * -1063.94356 +
                dVar8 * 6.48745674e-13 +
                dVar41 * -2.42032377e-09 +
                dVar3 * 3.282434e-06 + pmf_vals.arr[0] * -0.00149836708 + 3.78245636;
        local_638._8_4_ = SUB84(dVar9,0);
        local_638._0_8_ =
             dVar42 * 29122.2592 +
             dVar8 * 4.22531942e-13 +
             dVar41 * -1.53201656e-09 +
             dVar3 * 2.21435465e-06 + pmf_vals.arr[0] * -0.00163965942 + 3.1682671;
        local_638._12_4_ = (int)((ulong)dVar9 >> 0x20);
        dVar9 = dVar42 * -30293.7267 +
                dVar8 * 3.54395634e-13 +
                dVar41 * -1.37199266e-09 +
                dVar3 * 2.17346737e-06 + pmf_vals.arr[0] * -0.00101821705 + 4.19864056;
        local_628._8_4_ = SUB84(dVar9,0);
        local_628._0_8_ =
             dVar42 * 3615.08056 +
             dVar8 * 2.7282294e-13 +
             dVar41 * -9.70283332e-10 +
             dVar3 * 1.5393128e-06 + pmf_vals.arr[0] * -0.00120065876 + 3.99201543;
        local_628._12_4_ = (int)((ulong)dVar9 >> 0x20);
        dVar9 = dVar42 * 46004.0401 +
                dVar8 * 3.37483438e-13 +
                dVar41 * -9.62727883e-10 +
                dVar3 * 9.31632803e-07 + pmf_vals.arr[0] * 0.000484436072 + 3.76267867;
        local_618._8_4_ = SUB84(dVar9,0);
        local_618._0_8_ =
             dVar42 * 294.80804 +
             dVar8 * 1.85845025e-12 +
             dVar41 * -6.06909735e-09 +
             dVar3 * 7.05276303e-06 + pmf_vals.arr[0] * -0.00237456025 + 4.30179801;
        local_618._12_4_ = (int)((ulong)dVar9 >> 0x20);
        dVar9 = dVar42 * 16444.9988 +
                dVar8 * 5.08771468e-13 +
                dVar41 * -1.71779356e-09 +
                dVar3 * 1.91007285e-06 + pmf_vals.arr[0] * 0.00100547588 + 3.6735904;
        local_608._8_4_ = SUB84(dVar9,0);
        local_608._0_8_ =
             dVar42 * 50496.8163 +
             dVar8 * 3.88629474e-13 +
             dVar41 * -1.67203995e-09 +
             dVar3 * 2.74432073e-06 + pmf_vals.arr[0] * -0.0011833071 + 4.19860411;
        local_608._12_4_ = (int)((ulong)dVar9 >> 0x20);
        dVar9 = dVar42 * -14344.086 +
                dVar8 * -1.808849e-13 +
                dVar41 * 2.26751471e-10 +
                dVar3 * 3.3893811e-07 + pmf_vals.arr[0] * -0.00030517684 + 3.57953347;
        local_5f8._8_4_ = SUB84(dVar9,0);
        local_5f8._0_8_ =
             dVar42 * -10246.6476 +
             dVar8 * 3.33387912e-12 +
             dVar41 * -1.21185757e-08 +
             dVar3 * 1.63933533e-05 + pmf_vals.arr[0] * -0.0068354894 + 5.14987613;
        local_5f8._12_4_ = (int)((ulong)dVar9 >> 0x20);
        dVar9 = dVar42 * 3839.56496 +
                dVar8 * 8.6753773e-13 +
                dVar41 * -3.32860233e-09 +
                dVar3 * 4.59331487e-06 + pmf_vals.arr[0] * -0.00162196266 + 4.22118584;
        local_5e8._8_4_ = SUB84(dVar9,0);
        local_5e8._0_8_ =
             dVar42 * -48371.9697 +
             dVar8 * -2.87399096e-14 +
             dVar41 * 6.14797555e-10 +
             dVar3 * -2.3745209e-06 + pmf_vals.arr[0] * 0.00449229839 + 2.35677352;
        local_5e8._12_4_ = (int)((ulong)dVar9 >> 0x20);
        dVar9 = dVar42 * 978.6011 +
                dVar8 * 4.15122e-13 +
                dVar41 * -1.844409e-09 +
                dVar3 * 1.77949067e-06 + pmf_vals.arr[0] * 0.0036082975 + 2.106204;
        local_5d8._8_4_ = SUB84(dVar9,0);
        local_5d8._0_8_ =
             dVar42 * -14308.9567 +
             dVar8 * 2.63545304e-12 +
             dVar41 * -9.48213152e-09 +
             dVar3 * 1.24406669e-05 + pmf_vals.arr[0] * -0.00495416684 + 4.79372315;
        local_5d8._12_4_ = (int)((ulong)dVar9 >> 0x20);
        dVar12 = dVar42 * 5089.77593 +
                 dVar8 * 5.39768746e-12 +
                 dVar41 * -1.72897188e-08 +
                 dVar3 * 1.90330097e-05 + pmf_vals.arr[0] * -0.00378526124 + 3.95920148;
        dVar13 = dVar42 * 12841.6265 +
                 dVar8 * 4.61018008e-12 +
                 dVar41 * -1.49781651e-08 +
                 dVar3 * 1.65714269e-05 + pmf_vals.arr[0] * -0.00209329446 + 4.30646568;
        dVar10 = dVar8 * 5.37371542e-12 +
                 dVar41 * -1.77116571e-08 +
                 dVar3 * 1.99812763e-05 + pmf_vals.arr[0] * -0.00275077135 + 4.29142492;
        dVar11 = dVar8 * -4.889708e-13 +
                 dVar41 * 1.41037875e-09 +
                 dVar3 * -1.321074e-06 + pmf_vals.arr[0] * 0.0007041202 + 3.298677;
        dVar9 = -11522.2055;
        dVar6 = -1020.8999;
      }
      dVar11 = dVar42 * dVar6 + dVar11;
      local_5c8._8_4_ = SUB84(dVar13,0);
      local_5c8._0_8_ = dVar12;
      local_5c8._12_4_ = (int)((ulong)dVar13 >> 0x20);
      local_5b8._8_4_ = SUB84(dVar11,0);
      local_5b8._0_8_ = dVar42 * dVar9 + dVar10;
      local_5b8._12_4_ = (int)((ulong)dVar11 >> 0x20);
      local_5a8 = dVar42 * -745.375 +
                  dVar8 * 0.0 + dVar41 * 0.0 + dVar3 * 0.0 + pmf_vals.arr[0] * 0.0 + 2.5;
      for (lVar26 = 0; lVar26 != 0x15; lVar26 = lVar26 + 1) {
        *(double *)(local_648 + lVar26 * 8) =
             tmp[lVar26] * pmf_vals.arr[0] * 83144626.1815324 * *(double *)(local_648 + lVar26 * 8);
      }
      dVar42 = 0.0;
      for (lVar26 = 0; lVar26 != 0x15; lVar26 = lVar26 + 1) {
        dVar42 = dVar42 + *(double *)(local_528 + lVar26 * 8) * *(double *)(local_648 + lVar26 * 8);
      }
      local_660[0x19] = dVar2 * dVar42 * 0.0001;
      for (lVar26 = 0; lVar26 != 0x15; lVar26 = lVar26 + 1) {
        local_660[lVar26 + 4] = *(double *)(local_528 + lVar26 * 8) * local_660[3];
      }
      s_ext[6]._0_1_ = *(undefined1 *)(local_658 + 6);
      s_ext[4] = local_658[4];
      s_ext[5] = local_658[5];
      s_ext[2] = local_658[2];
      s_ext[3] = local_658[3];
      s_ext[0] = *local_658;
      s_ext[1] = local_658[1];
      if (ctrl_use_temp == false) {
        if (fuelName_abi_cxx11_._M_string_length == 0) {
          amrex::Abort_host("Using activeControl based on fuel mass requires ns.fuelName !");
        }
        pmf_vals.arr[0] = 0.0;
        pmf_vals.arr[1] = 0.0;
        pmf_vals.arr[2] = 0.0;
        pele::physics::eos::speciesNames<pele::physics::eos::Fuego>
                  ((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&pmf_vals);
        iVar34 = -1;
        iVar38 = 0;
        for (lVar26 = 0; lVar26 != 0x2a0; lVar26 = lVar26 + 0x20) {
          iVar20 = std::__cxx11::string::compare((string *)((long)pmf_vals.arr[0] + lVar26));
          if (iVar20 == 0) {
            iVar34 = iVar38;
          }
          iVar38 = iVar38 + 1;
        }
        ctrl_scale = dVar7 * s_ext[(long)iVar34 + (long)first_spec];
        ctrl_cfix = ctrl_scale * ctrl_h;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&pmf_vals);
      }
      else {
        ctrl_scale = 1.0;
        ctrl_cfix = ctrl_h;
      }
      pAVar17 = ac_parm;
      ctrl_V_in = s_ext[ctrl_flameDir];
      ctrl_V_in_old = ctrl_V_in;
      ac_parm->ctrl_V_in = ctrl_V_in;
      pAVar18 = ac_parm_d;
      uVar4 = pAVar17->ctrl_active;
      uVar16 = *(undefined4 *)&pAVar17->field_0x1c;
      ac_parm_d->ctrl_tBase = pAVar17->ctrl_tBase;
      pAVar18->ctrl_active = uVar4;
      *(undefined4 *)&pAVar18->field_0x1c = uVar16;
      RVar14 = pAVar17->ctrl_V_in;
      pAVar18->ctrl_dV = pAVar17->ctrl_dV;
      pAVar18->ctrl_V_in = RVar14;
      if ((ctrl_verbose != 0) && (ctrl_active == true)) {
        if (ctrl_use_temp == true) {
          poVar21 = amrex::OutStream();
          amrex::Print::Print((Print *)&pmf_vals,poVar21);
          std::operator<<((ostream *)(pmf_vals.arr + 2),
                          " Active control based on temperature iso-level activated.");
          std::operator<<((ostream *)(pmf_vals.arr + 2)," Maintaining the flame at ");
          pPVar22 = amrex::Print::operator<<((Print *)&pmf_vals,&ctrl_h);
          std::operator<<((ostream *)&pPVar22->ss," in ");
          pPVar22 = amrex::Print::operator<<(pPVar22,&ctrl_flameDir);
          std::operator<<((ostream *)&pPVar22->ss," direction. \n");
        }
        else {
          poVar21 = amrex::OutStream();
          amrex::Print::Print((Print *)&pmf_vals,poVar21);
          std::operator<<((ostream *)(pmf_vals.arr + 2),
                          " Active control based on fuel mass activated.");
          std::operator<<((ostream *)(pmf_vals.arr + 2)," Maintaining the flame at ");
          pPVar22 = amrex::Print::operator<<((Print *)&pmf_vals,&ctrl_h);
          std::operator<<((ostream *)&pPVar22->ss," in ");
          pPVar22 = amrex::Print::operator<<(pPVar22,&ctrl_flameDir);
          std::operator<<((ostream *)&pPVar22->ss," direction. \n");
        }
        amrex::Print::~Print((Print *)&pmf_vals);
      }
      amrex::PODVector<double,_std::allocator<double>_>::~PODVector(&s_ext_v);
    }
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&ppAC);
  }
  return;
}

Assistant:

void
PeleLM::initActiveControl()
{
   if (level!=0) return;

   if (verbose > 1) Print() <<  "PeleLM::initActiveControl()\n";

   // Parse input file
   ParmParse ppAC("active_control");
   ppAC.query("on",ctrl_active);
   ppAC.query("use_temp",ctrl_use_temp);
   ppAC.query("temperature",ctrl_temperature);
   ppAC.query("tau",ctrl_tauControl);
   ppAC.query("v",ctrl_verbose);
   ppAC.query("height",ctrl_h);
   ppAC.query("changeMax",ctrl_changeMax);
   ppAC.query("velMax",ctrl_velMax);
   ppAC.query("pseudo_gravity",ctrl_pseudoGravity);
   ppAC.query("flame_direction",ctrl_flameDir);
   ppAC.query("AC_history",ctrl_AChistory);
   ppAC.query("npoints_average",ctrl_NavgPts);
   ppAC.query("method",ctrl_method);

   // Active control checks
   if ( ctrl_use_temp && (ctrl_temperature <= 0.0) )
      amrex::Error("active_control.temperature MUST be set with active_control.use_temp = 1");

   if ( ctrl_active && (ctrl_tauControl <= 0.0) )
      amrex::Error("active_control.tau MUST be set when using active_control");

   if ( ctrl_active && (ctrl_h <= 0.0) )
      amrex::Error("active_control.height MUST be set when using active_control");

   if ( ctrl_active && ( ctrl_flameDir > 2 ) )
      amrex::Error("active_control.flame_direction MUST be 0, 1 or 2 for X, Y and Z resp.");

   // Exit here if AC not activated
   if ( !ctrl_active ) {
      ac_parm->ctrl_active = ctrl_active;
      amrex::Gpu::copy(amrex::Gpu::hostToDevice,ac_parm,ac_parm+1,ac_parm_d);
      return;
   }

   // Activate AC in problem specific / GPU compliant sections
   ac_parm->ctrl_active = ctrl_active;

   // Resize vector for temporal average
   ctrl_time_pts.resize(ctrl_NavgPts+1,-1.0);
   ctrl_velo_pts.resize(ctrl_NavgPts+1,-1.0);
   ctrl_cntl_pts.resize(ctrl_NavgPts+1,-1.0);

   // Compute some active control parameters
   Real area_tot = 1.0;
   const Real* problo = geom.ProbLo();
   const Real* probhi = geom.ProbHi();
   for (int dim = 0; dim < AMREX_SPACEDIM; dim++) {
      if (dim != ctrl_flameDir) area_tot *= (probhi[dim] - problo[dim]);
   }

   // Extract data from bc: assumes flow comes in from lo side of ctrl_flameDir
   ProbParm const* lprobparm = prob_parm_d;
   ACParm const* lacparm = ac_parm_d;
   pele::physics::PMF::PmfData::DataContainer const* lpmfdata = pmf_data.getDeviceData();
   amrex::Gpu::DeviceVector<amrex::Real> s_ext_v(DEF_NUM_STATE);
   amrex::Real* s_ext_d = s_ext_v.data();
   amrex::Real x[AMREX_SPACEDIM] = {AMREX_D_DECL(problo[0],problo[1],problo[2])};
   x[ctrl_flameDir] -= 1.0;
   const int ctrl_flameDir_l = ctrl_flameDir;
   const amrex::Real time_l = -1.0;
   const auto geomdata = geom.data();
   Box dumbx({AMREX_D_DECL(0,0,0)},{AMREX_D_DECL(0,0,0)});
   amrex::ParallelFor(dumbx, [x,s_ext_d,ctrl_flameDir_l,time_l,geomdata,lprobparm,lacparm, lpmfdata]
   AMREX_GPU_DEVICE(int /*i*/, int /*j*/, int /*k*/) noexcept
   {
      bcnormal(x, s_ext_d, ctrl_flameDir_l, 1, time_l, geomdata, *lprobparm, *lacparm, lpmfdata);
   });
   amrex::Real s_ext[DEF_NUM_STATE];
#ifdef AMREX_USE_GPU
   amrex::Gpu::dtoh_memcpy(s_ext,s_ext_d,sizeof(amrex::Real)*DEF_NUM_STATE);
#else
   std::memcpy(s_ext,s_ext_d,sizeof(amrex::Real)*DEF_NUM_STATE);
#endif

   if ( !ctrl_use_temp ) {
      // Get the fuel rhoY
      if (fuelName.empty()) {
          Abort("Using activeControl based on fuel mass requires ns.fuelName !");
      }
      Vector<std::string> specNames;
      pele::physics::eos::speciesNames<pele::physics::PhysicsType::eos_type>(specNames);
      int fuelidx = -1;
      for (int k = 0; k < NUM_SPECIES; k++) {
         if ( !specNames[k].compare(fuelName) ) fuelidx = k;
      }
      ctrl_scale = area_tot * s_ext[first_spec+fuelidx];
      ctrl_cfix  = ctrl_h * ctrl_scale;
   } else {
      // If using temp, scale is 1.0
      ctrl_scale = 1.0;
      ctrl_cfix = ctrl_h;
   }

   // Extract initial ctrl_V_in from bc
   ctrl_V_in  = s_ext[ctrl_flameDir];
   ctrl_V_in_old = ctrl_V_in;

   // Pass V_in to bc
   ac_parm->ctrl_V_in = ctrl_V_in;
   amrex::Gpu::copy(amrex::Gpu::hostToDevice,ac_parm,ac_parm+1,ac_parm_d);

   if ( ctrl_verbose && ctrl_active ) {
      if ( ctrl_use_temp ) {
         Print() << " Active control based on temperature iso-level activated."
                 << " Maintaining the flame at " << ctrl_h << " in " << ctrl_flameDir << " direction. \n";
      } else {
         Print() << " Active control based on fuel mass activated."
                 << " Maintaining the flame at " << ctrl_h << " in " << ctrl_flameDir << " direction. \n";
      }
   }
}